

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar3;
  undefined4 *puVar4;
  ulong uVar5;
  undefined6 in_register_0000003a;
  int iVar6;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,(uint)data->inlineCacheIndex);
  pPVar3 = ScriptContext::GetPropertyName(this,propertyId);
  iVar6 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar6 < 0x84) {
    switch(iVar6) {
    case 0x62:
    case 100:
      Output::Print(L" R%d = %s #%d",(ulong)data->Value,pPVar3 + 1,(ulong)data->inlineCacheIndex);
      return;
    case 99:
    case 0x65:
      Output::Print(L" R%d = %s #%d",(ulong)data->Value,pPVar3 + 1,(ulong)data->inlineCacheIndex);
LAB_007f2d74:
      Output::Print(L" <%d> ",(ulong)data->inlineCacheIndex);
      return;
    default:
      switch(iVar6) {
      case 0x74:
      case 0x7c:
        goto switchD_007f2ce0_caseD_74;
      case 0x75:
      case 0x7d:
        Output::Print(L" %s = R%d #%d",pPVar3 + 1,(ulong)data->Value,(ulong)data->inlineCacheIndex);
        goto LAB_007f2d74;
      }
    }
  }
  else {
    uVar5 = (ulong)(iVar6 - 0x112U);
    if (iVar6 - 0x112U < 0x22) {
      if ((0x2000005UL >> (uVar5 & 0x3f) & 1) != 0) {
switchD_007f2ce0_caseD_74:
        Output::Print(L" %s = R%d #%d",pPVar3 + 1,(ulong)data->Value,(ulong)data->inlineCacheIndex);
        return;
      }
      if ((0x300000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_007f2c91;
      if (uVar5 == 0x1f) goto LAB_007f2d97;
    }
    if (iVar6 - 0x88U < 2) {
LAB_007f2c91:
      Output::Print(L" %s = R%d, R%d #%d",pPVar3 + 1,(ulong)data->Value,1,
                    (ulong)data->inlineCacheIndex);
      return;
    }
    if (iVar6 == 0x84) {
LAB_007f2d97:
      Output::Print(L" R%d = %s, R%d #%d",(ulong)data->Value,pPVar3 + 1,1,
                    (ulong)data->inlineCacheIndex);
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                              ,0x401,"(false)","Unknown OpCode for OpLayoutElementP");
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeDumper::DumpElementP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::ScopedLdFldForTypeOf:
            case OpCode::ScopedLdFld:
                Output::Print(_u(" R%d = %s, R%d #%d"), data->Value, pPropertyName->GetBuffer(),
                    Js::FunctionBody::RootObjectRegSlot, data->inlineCacheIndex);
                break;

            case OpCode::ScopedStFld:
            case OpCode::ConsoleScopedStFld:
            case OpCode::ScopedStFldStrict:
            case OpCode::ConsoleScopedStFldStrict:
                Output::Print(_u(" %s = R%d, R%d #%d"), pPropertyName->GetBuffer(), data->Value,
                    Js::FunctionBody::RootObjectRegSlot, data->inlineCacheIndex);
                break;

            case OpCode::LdLocalFld:
            case OpCode::LdLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s #%d"), data->Value, pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;

            case OpCode::ProfiledLdLocalFld:
            case OpCode::ProfiledLdLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s #%d"), data->Value, pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;

            case OpCode::StLocalFld:
            case OpCode::InitLocalFld:
            case OpCode::InitLocalLetFld:
            case OpCode::InitUndeclLocalLetFld:
            case OpCode::InitUndeclLocalConstFld:
                Output::Print(_u(" %s = R%d #%d"), pPropertyName->GetBuffer(), data->Value, data->inlineCacheIndex);
                break;

            case OpCode::ProfiledStLocalFld:
            case OpCode::ProfiledInitLocalFld:
                Output::Print(_u(" %s = R%d #%d"), pPropertyName->GetBuffer(), data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;

            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementP");
                break;
            }
        }
    }